

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Strided_get(int g_a,int *lo,int *hi,int *skip,void *buf,int *ld)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Integer _ga_work [7];
  Integer _ga_skip [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  long alStack_138 [2];
  Integer aIStack_128 [7];
  long lStack_f0;
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  alStack_138[1] = 0x18f08b;
  lVar2 = pnga_ndim((long)g_a);
  lVar3 = lVar2;
  if (0 < lVar2) {
    do {
      (&lStack_70)[lVar3] = (long)*lo + 1;
      lo = lo + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    lVar3 = lVar2;
    if (0 < lVar2) {
      do {
        (&lStack_b0)[lVar3] = (long)*hi + 1;
        hi = hi + 1;
        lVar3 = lVar3 + -1;
        lVar1 = lVar2;
      } while (lVar3 != 0);
      for (; lVar1 != 1; lVar1 = lVar1 + -1) {
        alStack_138[lVar1] = (long)*ld;
        ld = ld + 1;
      }
      if (0 < lVar2) {
        do {
          (&lStack_f0)[lVar2] = (long)*skip;
          skip = skip + 1;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
  }
  alStack_138[1] = 0x18f120;
  pnga_strided_get((long)g_a,local_68,local_a8,local_e8,buf,aIStack_128);
  return;
}

Assistant:

void NGA_Strided_get(int g_a, int lo[], int hi[], int skip[],
                     void* buf, int ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_skip[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    COPYC2F(skip, _ga_skip, ndim);
    wnga_strided_get(a, _ga_lo, _ga_hi, _ga_skip, buf, _ga_work);
}